

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O0

double * inform_integration_evidence_part
                   (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,
                   double *evidence,inform_error *err)

{
  _Bool _Var1;
  int *series_00;
  bool bVar2;
  int *partitioned;
  size_t i;
  size_t *psStack_50;
  int allocate_parts;
  size_t *partitioning;
  size_t sStack_40;
  int allocate_evidence;
  size_t nparts_local;
  size_t *parts_local;
  int *b_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  _Var1 = check_arguments(series,l,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    bVar2 = evidence == (double *)0x0;
    if ((bVar2) && (evidence = (double *)malloc(n << 4), evidence == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      psStack_50 = parts;
      sStack_40 = nparts;
      if (parts == (size_t *)0x0) {
        psStack_50 = (size_t *)malloc(l << 3);
        if (psStack_50 == (size_t *)0x0) {
          if (bVar2) {
            free(evidence);
          }
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          return (double *)0x0;
        }
        for (partitioned = (int *)0x0; sStack_40 = l, partitioned < l;
            partitioned = (int *)((long)partitioned + 1)) {
          psStack_50[(long)partitioned] = (size_t)partitioned;
        }
      }
      series_00 = inform_black_box_parts(series,l,n,b,psStack_50,sStack_40,(int *)0x0,err);
      _Var1 = inform_succeeded(err);
      if (_Var1) {
        inform_local_mutual_info(series_00,sStack_40,n,series_00 + sStack_40 * n,evidence,err);
      }
      free(series_00);
      if (parts == (size_t *)0x0) {
        free(psStack_50);
      }
      _Var1 = inform_failed(err);
      if (_Var1) {
        if (bVar2) {
          free(evidence);
        }
        series_local = (int *)0x0;
      }
      else {
        series_local = (int *)evidence;
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_integration_evidence_part(int const *series, size_t l, size_t n,
    int const *b, size_t const *parts, size_t nparts, double *evidence,
    inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate_evidence = (evidence == NULL);
    if (allocate_evidence)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    size_t *partitioning = (size_t *)parts;
    int allocate_parts = (partitioning == NULL);
    if (allocate_parts)
    {
        partitioning = malloc(l * sizeof(size_t));
        if (partitioning == NULL)
        {
            if (allocate_evidence) free(evidence);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) partitioning[i] = i;
        nparts = l;
    }
    int *partitioned = inform_black_box_parts(series, l, n, b, partitioning,
        nparts, NULL, err);
    if (inform_succeeded(err))
    {
        inform_local_mutual_info(partitioned, nparts, n, partitioned + nparts*n,
            evidence, err);
    }
    free(partitioned);
    if (allocate_parts) free(partitioning);
    if (inform_failed(err))
    {
        if (allocate_evidence) free(evidence);
        return NULL;
    }
    return evidence;
}